

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O1

ggml_backend_reg_t ggml_backend_load_best(char *name,bool silent,char *user_search_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var3;
  char cVar4;
  int iVar5;
  value_type_conflict *__val;
  long *plVar6;
  ssize_t sVar7;
  path *path_00;
  long lVar8;
  void *pvVar9;
  code *pcVar10;
  ggml_backend_reg_t extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  size_type *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  pointer ppVar13;
  pointer __lhs;
  undefined7 in_register_00000031;
  path *__p;
  char *pcVar14;
  undefined1 auVar15 [16];
  vector<char,_std::allocator<char>_> path;
  string base_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  path best_path;
  directory_iterator dir_it;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  search_paths;
  path file_extension;
  path file_prefix;
  path name_path;
  int local_1bc;
  path local_1b8;
  path local_190;
  path local_168;
  path local_140;
  string_type local_118;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  char *local_c0;
  path *local_b8;
  path local_b0;
  path local_88;
  path local_60;
  char *local_38;
  
  local_c0 = (char *)CONCAT71(in_register_00000031,silent);
  local_38 = name;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_60,&local_38,auto_format);
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            (&local_b0,(char (*) [9])"libggml-",auto_format);
  std::operator+(&local_168._M_pathname,&local_b0._M_pathname,&local_60._M_pathname);
  std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
            (&local_140,(char (*) [2])0x107334,auto_format);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_168,(ulong)local_140._M_pathname._M_dataplus._M_p);
  paVar12 = &local_190._M_pathname.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_190._M_pathname.field_2._M_allocated_capacity = *psVar11;
    local_190._M_pathname.field_2._8_8_ = plVar6[3];
    local_190._M_pathname._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_190._M_pathname.field_2._M_allocated_capacity = *psVar11;
    local_190._M_pathname._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_190._M_pathname._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::filesystem::__cxx11::path::path(&local_88,&local_190._M_pathname,auto_format);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_pathname._M_dataplus._M_p != paVar12) {
    operator_delete(local_190._M_pathname._M_dataplus._M_p,
                    local_190._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_140);
  paVar1 = &local_168._M_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_168._M_pathname._M_dataplus._M_p,
                    local_168._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
            (&local_b0,(char (*) [4])".so",auto_format);
  local_f8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (path *)0x0;
  local_f8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (path *)0x0;
  local_f8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_c0 == (char *)0x0) {
    local_190._M_pathname.field_2._M_allocated_capacity._0_2_ = 0x2e;
    local_190._M_pathname._M_string_length = 1;
    local_1b8._M_pathname._M_dataplus._M_p = (pointer)0x0;
    local_1b8._M_pathname._M_string_length = 0;
    local_1b8._M_pathname.field_2._M_allocated_capacity = 0;
    local_190._M_pathname._M_dataplus._M_p = (pointer)paVar12;
    local_1b8._M_pathname._M_dataplus._M_p = (pointer)operator_new(0x400);
    pcVar14 = local_1b8._M_pathname._M_dataplus._M_p + 0x400;
    local_1b8._M_pathname._M_string_length = (size_type)local_1b8._M_pathname._M_dataplus._M_p;
    local_1b8._M_pathname.field_2._M_allocated_capacity = (size_type)pcVar14;
    memset(local_1b8._M_pathname._M_dataplus._M_p,0,0x400);
    local_1b8._M_pathname._M_string_length = (size_type)pcVar14;
    while (sVar7 = readlink("/proc/self/exe",local_1b8._M_pathname._M_dataplus._M_p,
                            local_1b8._M_pathname._M_string_length -
                            (long)local_1b8._M_pathname._M_dataplus._M_p), sVar7 != -1) {
      if (sVar7 < (long)(local_1b8._M_pathname._M_string_length -
                        (long)local_1b8._M_pathname._M_dataplus._M_p)) {
        local_168._M_pathname._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_168,local_1b8._M_pathname._M_dataplus._M_p,
                   local_1b8._M_pathname._M_dataplus._M_p + sVar7);
        std::__cxx11::string::operator=((string *)&local_190,(string *)&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_168._M_pathname._M_dataplus._M_p,
                          local_168._M_pathname.field_2._M_allocated_capacity + 1);
        }
        lVar8 = std::__cxx11::string::rfind((char)&local_190,0x2f);
        if (lVar8 != -1) {
          std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_190);
          std::__cxx11::string::operator=((string *)&local_190,(string *)&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_pathname._M_dataplus._M_p != paVar1) {
            operator_delete(local_168._M_pathname._M_dataplus._M_p,
                            local_168._M_pathname.field_2._M_allocated_capacity + 1);
          }
        }
        break;
      }
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)&local_1b8,
                 (local_1b8._M_pathname._M_string_length -
                 (long)local_1b8._M_pathname._M_dataplus._M_p) * 2);
    }
    local_168._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,local_190._M_pathname._M_dataplus._M_p,
               local_190._M_pathname._M_dataplus._M_p + local_190._M_pathname._M_string_length);
    std::__cxx11::string::append((char *)&local_168);
    std::filesystem::__cxx11::path::path(&local_140,&local_168._M_pathname,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_168._M_pathname._M_dataplus._M_p,
                      local_168._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_pathname._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1b8._M_pathname._M_dataplus._M_p,
                      local_1b8._M_pathname.field_2._M_allocated_capacity -
                      (long)local_1b8._M_pathname._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_pathname._M_dataplus._M_p != paVar12) {
      operator_delete(local_190._M_pathname._M_dataplus._M_p,
                      local_190._M_pathname.field_2._M_allocated_capacity + 1);
    }
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    emplace_back<std::filesystem::__cxx11::path>(&local_f8,&local_140);
    std::filesystem::__cxx11::path::~path(&local_140);
    std::filesystem::current_path_abi_cxx11_();
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    emplace_back<std::filesystem::__cxx11::path>(&local_f8,&local_140);
  }
  else {
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_140,&local_c0,auto_format);
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    emplace_back<std::filesystem::__cxx11::path>(&local_f8,&local_140);
  }
  std::filesystem::__cxx11::path::~path(&local_140);
  std::filesystem::__cxx11::path::path(&local_140);
  local_b8 = local_f8.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_f8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_f8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1bc = 0;
    ppVar13 = local_f8.
              super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      cVar4 = std::filesystem::status(ppVar13);
      if ((cVar4 == -1) || (cVar4 == '\0')) {
        path_str(&local_190._M_pathname,ppVar13);
        ggml_log_internal(1,"%s: search path %s does not exist\n","ggml_backend_load_best");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_pathname._M_dataplus._M_p != &local_190._M_pathname.field_2) {
          operator_delete(local_190._M_pathname._M_dataplus._M_p,
                          local_190._M_pathname.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::filesystem::__cxx11::directory_iterator::directory_iterator
                  ((directory_iterator *)&local_118,ppVar13,skip_permission_denied,(error_code *)0x0
                  );
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_118._M_string_length + 8) = *(int *)(local_118._M_string_length + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_118._M_string_length + 8) = *(int *)(local_118._M_string_length + 8) + 1;
          }
        }
        local_e0._M_dataplus._M_p = local_118._M_dataplus._M_p;
        local_e0._M_string_length = local_118._M_string_length;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_118._M_string_length + 8) = *(int *)(local_118._M_string_length + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_118._M_string_length + 8) = *(int *)(local_118._M_string_length + 8) + 1;
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length);
          }
        }
        while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_string_length !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          path_00 = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                                      ((directory_iterator *)&local_e0);
          cVar4 = *(char *)&path_00[1]._M_pathname._M_dataplus._M_p;
          if ((cVar4 == '\x03') || (cVar4 == '\0')) {
            cVar4 = std::filesystem::status(path_00);
          }
          if (cVar4 == '\x01') {
            sVar2 = (path_00->_M_pathname)._M_string_length;
            if (sVar2 == 0) {
LAB_00105255:
              std::filesystem::__cxx11::path::path(&local_190);
            }
            else {
              _Var3._M_head_impl =
                   (path_00->_M_cmpts)._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl;
              __p = path_00;
              if ((~(byte)_Var3._M_head_impl & 3) != 0) {
                if ((((ulong)_Var3._M_head_impl & 3) == 0) &&
                   ((path_00->_M_pathname)._M_dataplus._M_p[sVar2 - 1] != '/')) {
                  if (((ulong)_Var3._M_head_impl & 3) == 0) {
                    lVar8 = std::filesystem::__cxx11::path::_List::end();
                  }
                  else {
                    lVar8 = 0;
                  }
                  if ((*(byte *)&(path_00->_M_cmpts)._M_impl._M_t.
                                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                 .
                                 super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                 ._M_head_impl & 3) == 0) {
                    __p = (path *)(lVar8 + -0x30);
                  }
                  if ((~*(uint *)&(__p->_M_cmpts)._M_impl._M_t.
                                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  .
                                  super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                  ._M_head_impl & 3) == 0) goto LAB_0010524b;
                }
                goto LAB_00105255;
              }
LAB_0010524b:
              std::filesystem::__cxx11::path::path(&local_190,__p);
            }
            auVar15 = std::filesystem::__cxx11::path::_M_find_extension();
            if (auVar15._8_8_ == -1 || auVar15._0_8_ == 0) {
              std::filesystem::__cxx11::path::path(&local_168);
            }
            else {
              std::__cxx11::string::substr((ulong)&local_1b8,auVar15._0_8_);
              std::filesystem::__cxx11::path::path(&local_168,&local_1b8._M_pathname,auto_format);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_pathname._M_dataplus._M_p != &local_1b8._M_pathname.field_2) {
                operator_delete(local_1b8._M_pathname._M_dataplus._M_p,
                                (ulong)(local_1b8._M_pathname.field_2._M_allocated_capacity + 1));
              }
            }
            local_1b8._M_pathname._M_dataplus._M_p = (pointer)&local_1b8._M_pathname.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b8,local_88._M_pathname._M_dataplus._M_p,
                       local_88._M_pathname._M_dataplus._M_p + local_88._M_pathname._M_string_length
                      );
            lVar8 = std::__cxx11::string::find
                              ((char *)&local_190,(ulong)local_1b8._M_pathname._M_dataplus._M_p,0);
            if (lVar8 == 0) {
              iVar5 = std::filesystem::__cxx11::path::compare(&local_168);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_pathname._M_dataplus._M_p != &local_1b8._M_pathname.field_2) {
                operator_delete(local_1b8._M_pathname._M_dataplus._M_p,
                                (ulong)(local_1b8._M_pathname.field_2._M_allocated_capacity + 1));
              }
              if (iVar5 == 0) {
                pvVar9 = dl_load_library(path_00);
                if (((pvVar9 != (void *)0x0) &&
                    (pcVar10 = (code *)dlsym(pvVar9,"ggml_backend_score"), pcVar10 != (code *)0x0))
                   && (iVar5 = (*pcVar10)(), local_1bc < iVar5)) {
                  std::filesystem::__cxx11::path::operator=(&local_140,path_00);
                  local_1bc = iVar5;
                }
                if (pvVar9 != (void *)0x0) {
                  dlclose(pvVar9);
                }
              }
            }
            else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_1b8._M_pathname._M_dataplus._M_p != &local_1b8._M_pathname.field_2) {
              operator_delete(local_1b8._M_pathname._M_dataplus._M_p,
                              (ulong)(local_1b8._M_pathname.field_2._M_allocated_capacity + 1));
            }
            std::filesystem::__cxx11::path::~path(&local_168);
            std::filesystem::__cxx11::path::~path(&local_190);
          }
          std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)&local_e0);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length);
        }
      }
      ppVar13 = ppVar13 + 1;
    } while (ppVar13 != local_b8);
    if (local_1bc != 0) {
      get_reg();
      ggml_backend_registry::load_backend(&get_reg::reg,&local_140,true);
      goto LAB_001055e1;
    }
  }
  ppVar13 = local_f8.
            super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_f8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_f8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __lhs = local_f8.
            super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
                (&local_168,(char (*) [9])"libggml-",auto_format);
      std::operator+(&local_e0,&local_168._M_pathname,&local_60._M_pathname);
      std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
                (&local_1b8,(char (*) [4])".so",auto_format);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_e0,(ulong)local_1b8._M_pathname._M_dataplus._M_p);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar12) {
        local_118.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_118.field_2._8_8_ = plVar6[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_118._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_118._M_string_length = plVar6[1];
      *plVar6 = (long)paVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::filesystem::__cxx11::path::path(&local_190,&local_118,auto_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_168);
      std::filesystem::__cxx11::operator/(&local_168,__lhs,&local_190);
      cVar4 = std::filesystem::status(&local_168);
      if ((cVar4 != '\0') && (cVar4 != -1)) {
        get_reg();
        ggml_backend_registry::load_backend(&get_reg::reg,&local_168,true);
      }
      std::filesystem::__cxx11::path::~path(&local_168);
      std::filesystem::__cxx11::path::~path(&local_190);
    } while (((cVar4 == -1) || (cVar4 == '\0')) && (__lhs = __lhs + 1, __lhs != ppVar13));
  }
LAB_001055e1:
  std::filesystem::__cxx11::path::~path(&local_140);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector(&local_f8);
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::filesystem::__cxx11::path::~path(&local_88);
  std::filesystem::__cxx11::path::~path(&local_60);
  return extraout_RAX;
}

Assistant:

static ggml_backend_reg_t ggml_backend_load_best(const char * name, bool silent, const char * user_search_path) {
    // enumerate all the files that match [lib]ggml-name-*.[so|dll] in the search paths
    const fs::path name_path = fs::u8path(name);
    const fs::path file_prefix = backend_filename_prefix().native() + name_path.native() + fs::u8path("-").native();
    const fs::path file_extension = backend_filename_extension();

    std::vector<fs::path> search_paths;
    if (user_search_path == nullptr) {
        // default search paths: executable directory, current directory
        search_paths.push_back(get_executable_path());
        search_paths.push_back(fs::current_path());
    } else {
        search_paths.push_back(fs::u8path(user_search_path));
    }

    int best_score = 0;
    fs::path best_path;

    for (const auto & search_path : search_paths) {
        if (!fs::exists(search_path)) {
            GGML_LOG_DEBUG("%s: search path %s does not exist\n", __func__, path_str(search_path).c_str());
            continue;
        }
        fs::directory_iterator dir_it(search_path, fs::directory_options::skip_permission_denied);
        for (const auto & entry : dir_it) {
            if (entry.is_regular_file()) {
                auto filename = entry.path().filename();
                auto ext = entry.path().extension();
                if (filename.native().find(file_prefix) == 0 && ext == file_extension) {
                    dl_handle_ptr handle { dl_load_library(entry) };
                    if (!handle && !silent) {
                        GGML_LOG_ERROR("%s: failed to load %s\n", __func__, path_str(entry.path()).c_str());
                    }
                    if (handle) {
                        auto score_fn = (ggml_backend_score_t) dl_get_sym(handle.get(), "ggml_backend_score");
                        if (score_fn) {
                            int s = score_fn();
#ifndef NDEBUG
                            GGML_LOG_DEBUG("%s: %s score: %d\n", __func__, path_str(entry.path()).c_str(), s);
#endif
                            if (s > best_score) {
                                best_score = s;
                                best_path = entry.path();
                            }
                        } else {
                            if (!silent) {
                                GGML_LOG_INFO("%s: failed to find ggml_backend_score in %s\n", __func__, path_str(entry.path()).c_str());
                            }
                        }
                    }
                }
            }
        }
    }

    if (best_score == 0) {
        // try to load the base backend
        for (const auto & search_path : search_paths) {
            fs::path filename = backend_filename_prefix().native() + name_path.native() + backend_filename_extension().native();
            fs::path path = search_path / filename;
            if (fs::exists(path)) {
                return get_reg().load_backend(path, silent);
            }
        }
        return nullptr;
    }

    return get_reg().load_backend(best_path, silent);
}